

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# path.cpp
# Opt level: O2

path * __thiscall boost::filesystem::path::root_directory(path *__return_storage_ptr__,path *this)

{
  pointer pcVar1;
  size_type sVar2;
  
  sVar2 = anon_unknown.dwarf_14c2e::root_directory_start
                    (&this->m_pathname,(this->m_pathname)._M_string_length);
  if (sVar2 == 0xffffffffffffffff) {
    (__return_storage_ptr__->m_pathname)._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->m_pathname).field_2;
    (__return_storage_ptr__->m_pathname)._M_string_length = 0;
    (__return_storage_ptr__->m_pathname).field_2._M_local_buf[0] = '\0';
  }
  else {
    pcVar1 = (this->m_pathname)._M_dataplus._M_p;
    path<char_const*>(__return_storage_ptr__,pcVar1 + sVar2,pcVar1 + sVar2 + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

path path::root_directory() const
  {
    size_type pos(root_directory_start(m_pathname, m_pathname.size()));

    return pos == string_type::npos
      ? path()
      : path(m_pathname.c_str() + pos, m_pathname.c_str() + pos + 1);
  }